

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAuto.c
# Opt level: O2

void Abc_NtkAutoPrint(Abc_Ntk_t *pNtk,int Output,int fNaive,int fVerbose)

{
  int iVar1;
  DdManager *dd;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  void *pvVar10;
  undefined8 *puVar11;
  int *piVar12;
  undefined8 uVar13;
  char **__ptr;
  char **__ptr_00;
  DdNode *pDVar14;
  DdNode *pDVar15;
  DdNode *pDVar16;
  DdNode *pDVar17;
  abctime aVar18;
  DdNode *n;
  abctime aVar19;
  int iVar20;
  int i;
  long lVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  Vec_Ptr_t *p;
  long lVar26;
  double dVar27;
  uint local_94;
  void *local_88;
  uint local_80;
  uint local_78;
  uint local_74;
  
  pvVar10 = Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,fVerbose);
  if (pvVar10 == (void *)0x0) {
    return;
  }
  uVar6 = pNtk->vCis->nSize;
  uVar7 = pNtk->vCos->nSize;
  pvVar10 = Abc_NtkGlobalBdd(pNtk);
  dd = *(DdManager **)((long)pvVar10 + 0x10);
  p = pNtk->vCos;
  iVar5 = p->nSize;
  iVar22 = 8;
  if (6 < iVar5 - 1U) {
    iVar22 = iVar5;
  }
  if (iVar22 == 0) {
    local_88 = (void *)0x0;
  }
  else {
    local_88 = malloc((long)iVar22 << 3);
  }
  for (lVar21 = 0; i = (int)lVar21, i < iVar5; lVar21 = lVar21 + 1) {
    puVar11 = (undefined8 *)Vec_PtrEntry(p,i);
    piVar12 = (int *)Abc_NtkGlobalBdd((Abc_Ntk_t *)*puVar11);
    pvVar10 = *(void **)(piVar12 + 2);
    if (pvVar10 == (void *)0x0) {
      __assert_fail("p->pArrayPtr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                    ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
    }
    iVar5 = *(int *)(puVar11 + 2);
    lVar25 = (long)iVar5;
    iVar1 = *piVar12;
    if (iVar1 <= iVar5) {
      iVar20 = iVar5 + 10;
      if (iVar5 < iVar1 * 2) {
        iVar20 = iVar1 * 2;
      }
      if (iVar1 < iVar20) {
        pvVar10 = realloc(pvVar10,(long)iVar20 * 8);
        *(void **)(piVar12 + 2) = pvVar10;
        memset((void *)((long)pvVar10 + (long)*piVar12 * 8),0,((long)iVar20 - (long)*piVar12) * 8);
        *piVar12 = iVar20;
      }
    }
    lVar26 = *(long *)((long)pvVar10 + lVar25 * 8);
    if (lVar26 == 0) {
      if (*(code **)(piVar12 + 8) == (code *)0x0) {
        lVar26 = 0;
      }
      else {
        uVar13 = (**(code **)(piVar12 + 8))(*(undefined8 *)(piVar12 + 4));
        *(undefined8 *)(*(long *)(piVar12 + 2) + lVar25 * 8) = uVar13;
        lVar26 = *(long *)(*(long *)(piVar12 + 2) + lVar25 * 8);
      }
    }
    if (i == iVar22) {
      uVar23 = (ulong)(uint)(iVar22 * 2);
      if (iVar22 < 0x10) {
        uVar23 = 0x10;
      }
      iVar5 = (int)uVar23;
      if (iVar22 < iVar5) {
        iVar22 = iVar5;
        if (local_88 == (void *)0x0) {
          local_88 = malloc(uVar23 << 3);
        }
        else {
          local_88 = realloc(local_88,uVar23 << 3);
        }
      }
    }
    *(long *)((long)local_88 + lVar21 * 8) = lVar26;
    p = pNtk->vCos;
    iVar5 = p->nSize;
  }
  __ptr = Abc_NtkCollectCioNames(pNtk,0);
  __ptr_00 = Abc_NtkCollectCioNames(pNtk,1);
  if (fVerbose != 0) {
    uVar3 = Cudd_ReadKeys(dd);
    uVar4 = Cudd_ReadDead(dd);
    printf("Shared BDD size = %6d nodes.\n",(ulong)(uVar3 - uVar4));
  }
  uVar23 = 0;
  if (0 < (int)uVar6) {
    uVar23 = (ulong)uVar6;
  }
  while ((int)uVar23 != 0) {
    Cudd_bddNewVar(dd);
    uVar23 = (ulong)((int)uVar23 - 1);
  }
  iVar5 = Cudd_ReadSize(dd);
  if (iVar5 != uVar6 * 2) {
    __assert_fail("Cudd_ReadSize(dd) == 2 * nInputs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcAuto.c"
                  ,0x5b,"void Abc_NtkAutoPrint(Abc_Ntk_t *, int, int, int)");
  }
  Cudd_zddVarsFromBddVars(dd,2);
  if (Output == -1) {
    aVar18 = Abc_Clock();
    uVar23 = 0;
    if (0 < (int)uVar7) {
      uVar23 = (ulong)uVar7;
    }
    local_74 = 0;
    local_80 = 0;
    local_94 = 0;
    local_78 = 0;
    uVar3 = 0;
    for (uVar24 = 0; uVar23 != uVar24; uVar24 = uVar24 + 1) {
      pDVar14 = *(DdNode **)((long)local_88 + uVar24 * 8);
      pDVar14 = Extra_bddSpaceFromFunction(dd,pDVar14,pDVar14);
      Cudd_Ref(pDVar14);
      pDVar15 = Extra_bddSpaceCanonVars(dd,pDVar14);
      Cudd_Ref(pDVar15);
      pDVar16 = Extra_bddSpaceReduce(dd,*(DdNode **)((long)local_88 + uVar24 * 8),pDVar15);
      Cudd_Ref(pDVar16);
      pDVar17 = Extra_bddSpaceEquations(dd,pDVar14);
      Cudd_Ref(pDVar17);
      uVar4 = Cudd_SupportSize(dd,pDVar14);
      dVar27 = Cudd_CountMinterm(dd,pDVar14,uVar4);
      uVar8 = Extra_Base2LogDouble(dVar27);
      printf("Output #%3d: Inputs = %2d. AutoK = %2d.\n",uVar24 & 0xffffffff,(ulong)uVar4,
             (ulong)uVar8);
      if (0 < (int)uVar8) {
        local_78 = local_78 + 1;
        local_74 = local_74 + uVar8;
        uVar9 = local_80;
        if ((int)local_80 <= (int)uVar8) {
          uVar9 = uVar8;
        }
        bVar2 = (int)local_80 < (int)uVar8;
        local_80 = uVar9;
        if (bVar2) {
          local_94 = uVar4;
        }
      }
      if ((int)uVar3 <= (int)uVar4) {
        uVar3 = uVar4;
      }
      n = Extra_bddSpaceFromMatrixPos(dd,pDVar17);
      Cudd_Ref(n);
      if (pDVar14 != n) {
        puts("Spaces are NOT EQUAL!");
      }
      Cudd_RecursiveDeref(dd,pDVar14);
      Cudd_RecursiveDeref(dd,n);
      Cudd_RecursiveDeref(dd,pDVar15);
      Cudd_RecursiveDeref(dd,pDVar16);
      Cudd_RecursiveDerefZdd(dd,pDVar17);
    }
    puts("The cumulative statistics for all outputs:");
    printf("Ins=%3d ",(ulong)uVar6);
    printf("InMax=%3d   ",(ulong)uVar3);
    printf("Outs=%3d ",(ulong)uVar7);
    printf("Auto=%3d   ",(ulong)local_78);
    printf("SumK=%3d ",(ulong)local_74);
    printf("KMax=%2d ",(ulong)local_80);
    printf("Supp=%3d   ",(ulong)local_94);
    aVar19 = Abc_Clock();
    printf("Time=%4.2f ",(double)((float)(aVar19 - aVar18) / 1e+06));
    putchar(10);
  }
  else {
    pDVar14 = Extra_bddSpaceFromFunctionFast(dd,*(DdNode **)((long)local_88 + (long)Output * 8));
    Cudd_Ref(pDVar14);
    pDVar15 = Extra_bddSpaceCanonVars(dd,pDVar14);
    Cudd_Ref(pDVar15);
    pDVar16 = Extra_bddSpaceReduce(dd,*(DdNode **)((long)local_88 + (long)Output * 8),pDVar15);
    Cudd_Ref(pDVar16);
    pDVar17 = Extra_bddSpaceEquations(dd,pDVar14);
    Cudd_Ref(pDVar17);
    uVar6 = Cudd_SupportSize(dd,pDVar14);
    dVar27 = Cudd_CountMinterm(dd,pDVar14,uVar6);
    uVar7 = Extra_Base2LogDouble(dVar27);
    printf("Output #%3d: Inputs = %2d. AutoK = %2d.\n",Output,(ulong)uVar6,(ulong)uVar7);
    Cudd_RecursiveDeref(dd,pDVar14);
    Cudd_RecursiveDeref(dd,pDVar15);
    Cudd_RecursiveDeref(dd,pDVar16);
    Cudd_RecursiveDerefZdd(dd,pDVar17);
  }
  Abc_NtkFreeGlobalBdds(pNtk,1);
  free(__ptr);
  free(__ptr_00);
  free(local_88);
  return;
}

Assistant:

void Abc_NtkAutoPrint( Abc_Ntk_t * pNtk, int Output, int fNaive, int fVerbose )
{
    DdManager * dd;         // the BDD manager used to hold shared BDDs
    DdNode ** pbGlobal;     // temporary storage for global BDDs
    char ** pInputNames;    // pointers to the CI names
    char ** pOutputNames;   // pointers to the CO names
    int nOutputs, nInputs, i;
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj;

    // compute the global BDDs
    if ( Abc_NtkBuildGlobalBdds(pNtk, 10000000, 1, 1, 0, fVerbose) == NULL )
        return;

    // get information about the network
    nInputs  = Abc_NtkCiNum(pNtk);
    nOutputs = Abc_NtkCoNum(pNtk);
//    dd       = pNtk->pManGlob;
    dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );

    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );
    pbGlobal = (DdNode **)Vec_PtrArray( vFuncsGlob );

    // get the network names
    pInputNames = Abc_NtkCollectCioNames( pNtk, 0 );
    pOutputNames = Abc_NtkCollectCioNames( pNtk, 1 );

    // print the size of the BDDs
    if ( fVerbose )
        printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // allocate additional variables
    for ( i = 0; i < nInputs; i++ )
        Cudd_bddNewVar( dd );
    assert( Cudd_ReadSize(dd) == 2 * nInputs );

    // create ZDD variables in the manager
    Cudd_zddVarsFromBddVars( dd, 2 );

    // perform the analysis of the primary output functions for auto-symmetry
    if ( Output == -1 )
        Abc_NtkAutoPrintAll( dd, nInputs, pbGlobal, nOutputs, pInputNames, pOutputNames, fNaive );
    else
        Abc_NtkAutoPrintOne( dd, nInputs, pbGlobal, Output, pInputNames, pOutputNames, fNaive );

    // deref the PO functions
//    Abc_NtkFreeGlobalBdds( pNtk );
    // stop the global BDD manager
//    Extra_StopManager( pNtk->pManGlob );
//    pNtk->pManGlob = NULL;
    Abc_NtkFreeGlobalBdds( pNtk, 1 );
    ABC_FREE( pInputNames );
    ABC_FREE( pOutputNames );
    Vec_PtrFree( vFuncsGlob );
}